

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

Symbol * __thiscall
anon_unknown.dwarf_35f635::InstanceBuilder::createInstance
          (InstanceBuilder *this,HierarchicalInstanceSyntax *syntax)

{
  InstanceSymbol *this_00;
  int iVar1;
  undefined4 extraout_var;
  Scope *scope;
  EVP_PKEY_CTX *src;
  span<int,_18446744073709551615UL> local_68;
  span<const_int,_18446744073709551615UL> local_58;
  InstanceSymbol *local_48;
  InstanceSymbol *inst;
  type *loc;
  type *name;
  HierarchicalInstanceSyntax *local_18;
  HierarchicalInstanceSyntax *syntax_local;
  InstanceBuilder *this_local;
  
  local_18 = syntax;
  syntax_local = (HierarchicalInstanceSyntax *)this;
  getNameLoc((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *)
             &name,syntax);
  loc = (type *)std::
                get<0ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                          ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                            *)&name);
  inst = (InstanceSymbol *)
         std::get<1ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                   ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                     *)&name);
  local_48 = slang::BumpAllocator::
             emplace<slang::ast::InstanceSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Definition_const&,slang::ast::ParameterBuilder&,bool&>
                       (&this->compilation->super_BumpAllocator,this->compilation,
                        (basic_string_view<char,_std::char_traits<char>_> *)loc,
                        (SourceLocation *)inst,this->definition,this->paramBuilder,
                        &this->isUninstantiated);
  iVar1 = slang::SmallVectorBase<int>::copy
                    (&(this->path).super_SmallVectorBase<int>,(EVP_PKEY_CTX *)this->compilation,src)
  ;
  local_68.data_ = (pointer)CONCAT44(extraout_var,iVar1);
  nonstd::span_lite::span<const_int,_18446744073709551615UL>::span<int,_18446744073709551615UL,_0>
            (&local_58,&local_68);
  (local_48->super_InstanceSymbolBase).arrayPath.data_ = local_58.data_;
  (local_48->super_InstanceSymbolBase).arrayPath.size_ = local_58.size_;
  slang::ast::Symbol::setSyntax((Symbol *)local_48,&local_18->super_SyntaxNode);
  this_00 = local_48;
  scope = slang::not_null<const_slang::ast::Scope_*>::operator*(&this->context->scope);
  slang::ast::Symbol::setAttributes((Symbol *)this_00,scope,this->attributes);
  return (Symbol *)local_48;
}

Assistant:

Symbol* createInstance(const HierarchicalInstanceSyntax& syntax) {
        auto [name, loc] = getNameLoc(syntax);
        auto inst = compilation.emplace<InstanceSymbol>(compilation, name, loc, definition,
                                                        paramBuilder, isUninstantiated);

        inst->arrayPath = path.copy(compilation);
        inst->setSyntax(syntax);
        inst->setAttributes(*context.scope, attributes);
        return inst;
    }